

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.cpp
# Opt level: O0

PropStatus __thiscall spvtools::opt::CCPPass::VisitPhi(CCPPass *this,Instruction *phi)

{
  bool bVar1;
  uint32_t uVar2;
  PropStatus PVar3;
  pointer this_00;
  pointer ppVar4;
  mapped_type *pmVar5;
  uint32_t local_44;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_40;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_38;
  iterator it;
  uint local_28;
  uint32_t phi_arg_id;
  uint32_t i;
  uint32_t meet_val_id;
  Instruction *phi_local;
  CCPPass *this_local;
  
  phi_arg_id = 0;
  local_28 = 2;
  do {
    uVar2 = opt::Instruction::NumOperands(phi);
    if (uVar2 <= local_28) {
      if (phi_arg_id != 0) {
        local_44 = opt::Instruction::result_id(phi);
        pmVar5 = std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](&this->values_,&local_44);
        *pmVar5 = phi_arg_id;
      }
      this_local._4_4_ = (PropStatus)(phi_arg_id != 0);
      return this_local._4_4_;
    }
    this_00 = std::
              unique_ptr<spvtools::opt::SSAPropagator,_std::default_delete<spvtools::opt::SSAPropagator>_>
              ::operator->(&this->propagator_);
    bVar1 = SSAPropagator::IsPhiArgExecutable(this_00,phi,local_28);
    if (bVar1) {
      it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_
           = opt::Instruction::GetSingleWordOperand(phi,local_28);
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::find(&this->values_,
                  (key_type *)
                  ((long)&it.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur + 4));
      local_40._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end(&this->values_);
      bVar1 = std::__detail::operator!=(&local_38,&local_40);
      if (bVar1) {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                             *)&local_38);
        if (ppVar4->second == 0xffffffff) {
          PVar3 = MarkInstructionVarying(this,phi);
          return PVar3;
        }
        if (phi_arg_id == 0) {
          ppVar4 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                   operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                               *)&local_38);
          phi_arg_id = ppVar4->second;
        }
        else {
          ppVar4 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                   operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                               *)&local_38);
          if (ppVar4->second != phi_arg_id) {
            PVar3 = MarkInstructionVarying(this,phi);
            return PVar3;
          }
        }
      }
    }
    local_28 = local_28 + 2;
  } while( true );
}

Assistant:

SSAPropagator::PropStatus CCPPass::VisitPhi(Instruction* phi) {
  uint32_t meet_val_id = 0;

  // Implement the lattice meet operation. The result of this Phi instruction is
  // interesting only if the meet operation over arguments coming through
  // executable edges yields the same constant value.
  for (uint32_t i = 2; i < phi->NumOperands(); i += 2) {
    if (!propagator_->IsPhiArgExecutable(phi, i)) {
      // Ignore arguments coming through non-executable edges.
      continue;
    }
    uint32_t phi_arg_id = phi->GetSingleWordOperand(i);
    auto it = values_.find(phi_arg_id);
    if (it != values_.end()) {
      // We found an argument with a constant value.  Apply the meet operation
      // with the previous arguments.
      if (it->second == kVaryingSSAId) {
        // The "constant" value is actually a placeholder for varying. Return
        // varying for this phi.
        return MarkInstructionVarying(phi);
      } else if (meet_val_id == 0) {
        // This is the first argument we find.  Initialize the result to its
        // constant value id.
        meet_val_id = it->second;
      } else if (it->second == meet_val_id) {
        // The argument is the same constant value already computed. Continue
        // looking.
        continue;
      } else {
        // We either found a varying value, or another constant value different
        // from the previous computed meet value.  This Phi will never be
        // constant.
        return MarkInstructionVarying(phi);
      }
    } else {
      // The incoming value has no recorded value and is therefore not
      // interesting. A not interesting value joined with any other value is the
      // other value.
      continue;
    }
  }

  // If there are no incoming executable edges, the meet ID will still be 0. In
  // that case, return not interesting to evaluate the Phi node again.
  if (meet_val_id == 0) {
    return SSAPropagator::kNotInteresting;
  }

  // All the operands have the same constant value represented by |meet_val_id|.
  // Set the Phi's result to that value and declare it interesting.
  values_[phi->result_id()] = meet_val_id;
  return SSAPropagator::kInteresting;
}